

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

JavascriptArray * Js::JavascriptNativeIntArray::ToVarArray(JavascriptNativeIntArray *intArray)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  ArrayCallSiteInfo *this;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  undefined1 uVar6;
  undefined1 local_f0 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *local_40;
  JavascriptFunction *caller;
  
  walker.currentFrame.stackCheckCodeHeight =
       (size_t)((((((intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                    super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  uVar6 = ((ThreadContext *)walker.currentFrame.stackCheckCodeHeight)->noJsReentrancy;
  ((ThreadContext *)walker.currentFrame.stackCheckCodeHeight)->noJsReentrancy = true;
  this = JavascriptNativeArray::GetArrayCallSiteInfo(&intArray->super_JavascriptNativeArray);
  if (this != (ArrayCallSiteInfo *)0x0) {
    caller._7_1_ = uVar6;
    JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)local_f0,
               (((((intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,true,(PVOID)0x0,false);
    local_40 = (JavascriptFunction *)0x0;
    do {
      do {
        BVar3 = JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_f0,&local_40,true);
        uVar6 = caller._7_1_;
        if (BVar3 == 0) {
          bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,NativeArrayConversionPhase);
          if (!bVar2) goto LAB_00a42933;
          Output::Print(L"Conversion: Int array to Var array across ScriptContexts");
          goto LAB_00a4292e;
        }
      } while (local_40 == (JavascriptFunction *)0x0);
      BVar3 = JavascriptFunction::IsScriptFunction(local_40);
      uVar6 = caller._7_1_;
    } while (BVar3 == 0);
    if (local_40 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x854,"(caller)","caller");
      if (!bVar2) goto LAB_00a42974;
      *puVar4 = 0;
    }
    pFVar5 = JavascriptFunction::GetFunctionBody(local_40);
    if (pFVar5 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x855,"(caller->GetFunctionBody())","caller->GetFunctionBody()");
      if (!bVar2) {
LAB_00a42974:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pFVar5 = JavascriptFunction::GetFunctionBody(local_40);
    sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
    pFVar5 = JavascriptFunction::GetFunctionBody(local_40);
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar5);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,NativeArrayConversionPhase,sourceContextId,
                              functionId);
    if (bVar2) {
      Output::Print(L"Conversion: Int array to Var array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"
                    ,(ulong)this->functionNumber,(ulong)this->callSiteNumber);
LAB_00a4292e:
      Output::Flush();
    }
LAB_00a42933:
    ArrayCallSiteInfo::SetIsNotNativeArray(this);
    JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_f0);
  }
  (intArray->super_JavascriptNativeArray).weakRefToFuncBody.ptr =
       (RecyclerWeakReference<Js::FunctionBody> *)0x0;
  ConvertToVarArray(intArray);
  *(undefined1 *)(walker.currentFrame.stackCheckCodeHeight + 0x108) = uVar6;
  return (JavascriptArray *)intArray;
}

Assistant:

JavascriptArray *JavascriptNativeIntArray::ToVarArray(JavascriptNativeIntArray *intArray)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(IntArr_ToVarArray, reentrancylock, intArray->GetScriptContext()->GetThreadContext());
#if ENABLE_PROFILE_INFO
        ArrayCallSiteInfo *arrayInfo = intArray->GetArrayCallSiteInfo();
        if (arrayInfo)
        {
#if DBG
            Js::JavascriptStackWalker walker(intArray->GetScriptContext());
            Js::JavascriptFunction* caller = nullptr;
            bool foundScriptCaller = false;
            while(walker.GetCaller(&caller))
            {
                if(caller != nullptr && Js::ScriptFunction::Test(caller))
                {
                    foundScriptCaller = true;
                    break;
                }
            }

            if(foundScriptCaller)
            {
                Assert(caller);
                Assert(caller->GetFunctionBody());
                if(PHASE_TRACE(Js::NativeArrayConversionPhase, caller->GetFunctionBody()))
                {
                    Output::Print(_u("Conversion: Int array to Var array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"), arrayInfo->functionNumber, arrayInfo->callSiteNumber);
                    Output::Flush();
                }
            }
            else
            {
                if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
                {
                    Output::Print(_u("Conversion: Int array to Var array across ScriptContexts"));
                    Output::Flush();
                }
            }
#else
            if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
            {
                Output::Print(_u("Conversion: Int array to Var array"));
                Output::Flush();
            }
#endif

            arrayInfo->SetIsNotNativeArray();
        }
#endif

        intArray->ClearArrayCallSiteIndex();

        return ConvertToVarArray(intArray);
        JIT_HELPER_END(IntArr_ToVarArray);
    }